

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
burst::bitap<unsigned_short,std::__cxx11::string,std::__cxx11::string>
          (iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,burst *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text)

{
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_b0 [8];
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> local_70;
  undefined1 local_60 [8];
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> bitap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern_local;
  
  algorithm::make_bitap<unsigned_short,std::__cxx11::string>
            ((algorithm *)&begin.m_text_end,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>::bitap
            (&local_70,
             (bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> *)&begin.m_text_end);
  make_bitap_iterator<char,unsigned_short,std::array<unsigned_short,256ul>,std::__cxx11::string>
            ((bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_60,(burst *)&local_70,
             (bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> *)pattern,text);
  algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>::~bitap(&local_70);
  make_bitap_iterator<char,unsigned_short,std::array<unsigned_short,256ul>,std::__cxx11::string>
            (local_b0,(burst *)local_60);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::bitap_iterator(&local_e8,
                   (bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_60);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::bitap_iterator(&local_118,
                   (bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b0);
  boost::
  make_iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>,std::__cxx11::string>>
            (__return_storage_ptr__,(boost *)&local_e8,&local_118,
             (bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)text);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~bitap_iterator(&local_118);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~bitap_iterator(&local_e8);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~bitap_iterator((bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_b0);
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~bitap_iterator((bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_60);
  algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>::~bitap
            ((bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> *)&begin.m_text_end);
  return __return_storage_ptr__;
}

Assistant:

auto bitap (const ForwardRange1 & pattern, const ForwardRange2 & text)
    {
        auto bitap = algorithm::make_bitap<Bitmask>(pattern);
        auto begin = make_bitap_iterator(std::move(bitap), text);
        auto end = make_bitap_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }